

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::visitBreakWithType
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Break *curr,Type type)

{
  undefined8 curr_00;
  bool bVar1;
  optional<wasm::Type> labelType;
  Ok local_a5;
  uint local_a4;
  Err local_a0;
  Err *local_70;
  Err *err;
  undefined1 local_60;
  undefined3 uStack_5f;
  ChildPopper local_58;
  undefined1 local_50 [8];
  Result<wasm::Ok> _val;
  Break *curr_local;
  IRBuilder *this_local;
  Type type_local;
  
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = curr;
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  ChildPopper::ChildPopper(&local_58,this);
  curr_00 = _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
  std::optional<wasm::Type>::optional<wasm::Type_&,_true>
            ((optional<wasm::Type> *)&err,(Type *)&this_local);
  labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)err;
  labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_60;
  labelType.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = uStack_5f;
  ChildPopper::visitBreak((Result<wasm::Ok> *)local_50,&local_58,(Break *)curr_00,labelType);
  local_70 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_50);
  bVar1 = local_70 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_a0,local_70);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a0);
    wasm::Err::~Err(&local_a0);
  }
  local_a4 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_50);
  if (local_a4 == 0) {
    Break::finalize((Break *)_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    push(this,(Expression *)
              _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_a5);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::visitBreakWithType(Break* curr, Type type) {
  CHECK_ERR(ChildPopper{*this}.visitBreak(curr, type));
  curr->finalize();
  push(curr);
  return Ok{};
}